

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.c
# Opt level: O3

int stlrwt_(double *y,int *n,double *fit,double *rw)

{
  uint n_00;
  uint uVar1;
  ulong uVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  int local_40;
  int local_3c;
  int mid [2];
  
  n_00 = *n;
  if (0 < (int)n_00) {
    uVar2 = 0;
    do {
      rw[uVar2] = ABS(y[uVar2] - fit[uVar2]);
      uVar2 = uVar2 + 1;
    } while (n_00 != uVar2);
  }
  local_40 = (int)n_00 / 2 + 1;
  iVar3 = n_00 - local_40;
  local_3c = iVar3 + 1;
  mid = (int  [2])n;
  psort_(rw,n_00,&local_40,2);
  uVar1 = *(uint *)mid;
  if (0 < (int)uVar1) {
    dVar4 = (rw[(int)n_00 / 2] + rw[iVar3]) * 3.0;
    uVar2 = 0;
    do {
      dVar5 = ABS(y[uVar2] - fit[uVar2]);
      dVar6 = 1.0;
      if ((dVar4 * 0.001 < dVar5) && (dVar6 = 0.0, dVar5 <= dVar4 * 0.999)) {
        dVar6 = 1.0 - (dVar5 / dVar4) * (dVar5 / dVar4);
        dVar6 = dVar6 * dVar6;
      }
      rw[uVar2] = dVar6;
      uVar2 = uVar2 + 1;
    } while (uVar1 != uVar2);
  }
  return 0;
}

Assistant:

int stlrwt_(double *y, int *n, double *fit, double *rw)
{
    /* System generated locals */
    int i__1;
    double d__1, d__2;

    /* Local variables */
    int i__;
    double r__, c1, c9;
    int mid[2];
    double cmad;
	int c__2 = 2;

/* Robustness Weights */
/* 	rw_i := B( |y_i - fit_i| / (6 M) ),   i = 1,2,...,n */
/* 		where B(u) = (1 - u^2)^2  * 1[|u| < 1]   {Tukey's biweight} */
/* 		and   M := median{ |y_i - fit_i| } */
/* Arg */
/* Var */
    /* Parameter adjustments */
    --rw;
    --fit;
    --y;

    /* Function Body */
    i__1 = *n;
    for (i__ = 1; i__ <= i__1; ++i__) {
	rw[i__] = (d__1 = y[i__] - fit[i__], fabs(d__1));
/* L7: */
    }
    mid[0] = *n / 2 + 1;
    mid[1] = *n - mid[0] + 1;
    psort_(&rw[1], *n, mid, c__2);
    cmad = (rw[mid[0]] + rw[mid[1]]) * 3.0;
/*     = 6 * MAD */
    c9 = cmad * .999;
    c1 = cmad * .001;
    i__1 = *n;
    for (i__ = 1; i__ <= i__1; ++i__) {
	r__ = (d__1 = y[i__] - fit[i__], fabs(d__1));
	if (r__ <= c1) {
	    rw[i__] = 1.f;
	} else if (r__ <= c9) {
/* Computing 2nd power */
	    d__2 = r__ / cmad;
/* Computing 2nd power */
	    d__1 = 1.f - d__2 * d__2;
	    rw[i__] = d__1 * d__1;
	} else {
	    rw[i__] = 0.0;
	}
/* L10: */
    }
    return 0;
}